

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CowConfig.hpp
# Opt level: O2

void __thiscall CowConfig::CowConfig(CowConfig *this,string *fileName)

{
  string local_40;
  
  std::ofstream::ofstream(this);
  std::fstream::fstream(&this->ReadConfig);
  this->FirstLine = true;
  this->FirstRead = true;
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  (this->Lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)fileName);
  OpenFile(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

CowConfig(std::string fileName){
    		OpenFile(fileName);
	}